

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          int *args_3,char *args_4,char (*args_5) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
          char (*args_7) [2])

{
  std::operator<<((ostream *)oss,*arg);
  SetWhat<char,int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
            (this,oss,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }